

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O0

void __thiscall UrlParserTest::email_url::test_method(email_url *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  string local_328;
  basic_cstring<const_char> local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2f8;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  string local_2b0;
  basic_cstring<const_char> local_290;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_280;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  string local_238;
  basic_cstring<const_char> local_218;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_208;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  undefined1 local_1ba;
  undefined1 local_1b9;
  basic_cstring<const_char> local_1b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1a8;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170 [2];
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  UrlParser parser;
  char *text;
  email_url *this_local;
  
  parser.url._256_8_ = anon_var_dwarf_7fb2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"mailto:username@example.com",&local_149);
  httpparser::UrlParser::UrlParser((UrlParser *)local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_170,0x76,&local_180);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a8,plVar3,(char (*) [1])0x12449e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    local_1b9 = httpparser::UrlParser::isValid((UrlParser *)local_128);
    local_1ba = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_1a8,&local_1b8,0x76,1,2,&local_1b9,"parser.isValid()",&local_1ba,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x77,&local_1e0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_208,plVar3,(char (*) [1])0x12449e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    httpparser::UrlParser::scheme_abi_cxx11_(&local_238,(UrlParser *)local_128);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (&local_208,&local_218,0x77,1,2,&local_238,"parser.scheme()","mailto","\"mailto\"");
    std::__cxx11::string::~string((string *)&local_238);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_208);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_258);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x78,&local_258);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_280,plVar3,(char (*) [1])0x12449e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    httpparser::UrlParser::username_abi_cxx11_(&local_2b0,(UrlParser *)local_128);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (&local_280,&local_290,0x78,1,2,&local_2b0,"parser.username()","username",
               "\"username\"");
    std::__cxx11::string::~string((string *)&local_2b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_280);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c0,0x79,&local_2d0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2f8,plVar3,(char (*) [1])0x12449e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp"
               ,0x5c);
    httpparser::UrlParser::hostname_abi_cxx11_(&local_328,(UrlParser *)local_128);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (&local_2f8,&local_308,0x79,1,2,&local_328,"parser.hostname()","example.com",
               "\"example.com\"");
    std::__cxx11::string::~string((string *)&local_328);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  httpparser::UrlParser::~UrlParser((UrlParser *)local_128);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(email_url)
{
    const char *text = "mailto:username@example.com";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "mailto");
    BOOST_CHECK_EQUAL(parser.username(), "username");
    BOOST_CHECK_EQUAL(parser.hostname(), "example.com");
}